

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::Update
          (LocalStorage *this,DataTable *table,Vector *row_ids,
          vector<duckdb::PhysicalIndex,_true> *column_ids,DataChunk *updates)

{
  row_t *ids;
  TransactionData transaction;
  RowGroupCollection *this_00;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_48;
  TransactionData local_40;
  
  local_48 = LocalTableManager::GetStorage(&this->table_manager,table);
  ids = (row_t *)row_ids->data;
  optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_48);
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_48.ptr)->row_groups);
  TransactionData::TransactionData(&local_40,0,0);
  transaction.transaction_id = local_40.transaction_id;
  transaction.transaction.ptr = local_40.transaction.ptr;
  transaction.start_time = local_40.start_time;
  RowGroupCollection::Update(this_00,transaction,ids,column_ids,updates);
  return;
}

Assistant:

void LocalStorage::Update(DataTable &table, Vector &row_ids, const vector<PhysicalIndex> &column_ids,
                          DataChunk &updates) {
	D_ASSERT(updates.size() >= 1);
	auto storage = table_manager.GetStorage(table);
	D_ASSERT(storage);

	auto ids = FlatVector::GetData<row_t>(row_ids);
	storage->row_groups->Update(TransactionData(0, 0), ids, column_ids, updates);
}